

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginDisabled(bool disabled)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  int *__src;
  ImGuiContext *pIVar4;
  int *__dest;
  int iVar5;
  int iVar6;
  
  pIVar4 = GImGui;
  uVar2 = GImGui->CurrentItemFlags;
  if ((uVar2 >> 10 & 1) == 0 && disabled) {
    fVar1 = (GImGui->Style).Alpha;
    GImGui->DisabledAlphaBackup = fVar1;
    (pIVar4->Style).Alpha = fVar1 * (pIVar4->Style).DisabledAlpha;
  }
  if ((uVar2 >> 10 & 1) != 0 || disabled) {
    pIVar4->CurrentItemFlags = uVar2 | 0x400;
  }
  iVar6 = (pIVar4->ItemFlagsStack).Size;
  iVar3 = (pIVar4->ItemFlagsStack).Capacity;
  if (iVar6 == iVar3) {
    iVar6 = iVar6 + 1;
    if (iVar3 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar3 / 2 + iVar3;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar3 < iVar6) {
      __dest = (int *)MemAlloc((long)iVar6 << 2);
      __src = (pIVar4->ItemFlagsStack).Data;
      if (__src != (int *)0x0) {
        memcpy(__dest,__src,(long)(pIVar4->ItemFlagsStack).Size << 2);
        MemFree((pIVar4->ItemFlagsStack).Data);
      }
      (pIVar4->ItemFlagsStack).Data = __dest;
      (pIVar4->ItemFlagsStack).Capacity = iVar6;
    }
  }
  (pIVar4->ItemFlagsStack).Data[(pIVar4->ItemFlagsStack).Size] = pIVar4->CurrentItemFlags;
  (pIVar4->ItemFlagsStack).Size = (pIVar4->ItemFlagsStack).Size + 1;
  pIVar4->DisabledStackSize = pIVar4->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabled(bool disabled)
{
    ImGuiContext& g = *GImGui;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    if (!was_disabled && disabled)
    {
        g.DisabledAlphaBackup = g.Style.Alpha;
        g.Style.Alpha *= g.Style.DisabledAlpha; // PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * g.Style.DisabledAlpha);
    }
    if (was_disabled || disabled)
        g.CurrentItemFlags |= ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags); // FIXME-OPT: can we simply skip this and use DisabledStackSize?
    g.DisabledStackSize++;
}